

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cxx
# Opt level: O2

void showTime(OledI2C *oled)

{
  tm *__tp;
  size_t sVar1;
  OledPoint location;
  time_t now;
  char date [12];
  char time [12];
  
  ::time(&now);
  __tp = localtime(&now);
  sVar1 = strftime(time,0xc,"%l:%M:%S %P",__tp);
  location.m_y = 0x12;
  location.m_x = (int)(sVar1 * -8 + 0x80 >> 1);
  location = SSD1306::drawString8x16(&location,time,Set,&oled->super_OledPixel);
  sVar1 = strftime(date,0xc,"%d %b %Y",__tp);
  location.m_y = location.m_y + 0x14;
  location.m_x = (int)(sVar1 * -8 + 0x80 >> 1);
  location = SSD1306::drawString8x8(&location,date,Set,&oled->super_OledPixel);
  (*(oled->super_OledHardware)._vptr_OledHardware[7])(oled);
  return;
}

Assistant:

void
showTime(
    SSD1306::OledI2C& oled)
{
    //---------------------------------------------------------------------

    time_t now;
    time(&now);
    struct tm* tm = localtime(&now);

    //---------------------------------------------------------------------

    static constexpr SSD1306::PixelStyle style{SSD1306::PixelStyle::Set};

    //---------------------------------------------------------------------

    char time[12];

    auto length = strftime(time, sizeof(time), "%l:%M:%S %P", tm);
    int offset = (128 - (8 * length)) / 2;

    SSD1306::OledPoint location{offset, 18};

    location = drawString8x16(location, time, style, oled);

    //---------------------------------------------------------------------

    char date[12];

    length = strftime(date, sizeof(date), "%d %b %Y", tm);
    offset = (128 - (8 * length)) / 2;

    location.set(offset, location.y() + 20);

    location = drawString8x8(location, date, style, oled);

    //---------------------------------------------------------------------

    oled.displayUpdate();
}